

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O1

complex<float> cdotu(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  complex<float> in_RAX;
  complex<float> cVar1;
  ulong uVar2;
  complex<float> *pcVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (n < 1) {
    return (complex<float>)in_RAX._M_value;
  }
  cVar1._M_value = (_ComplexT_conflict)(incx ^ 1U);
  if (incy == 1 && (incx ^ 1U) == 0) {
    uVar2 = 0;
    do {
      fVar6 = *(float *)((long)&cy[uVar2]._M_value + 4);
      fVar5 = (float)cx[uVar2]._M_value;
      fVar7 = (float)(cx[uVar2]._M_value >> 0x20);
      if ((NAN(*(float *)&cy[uVar2]._M_value * fVar5 - fVar7 * fVar6)) &&
         (NAN(*(float *)&cy[uVar2]._M_value * fVar7 + fVar5 * fVar6))) {
        cVar1._M_value = __mulsc3(fVar5);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  else {
    cVar1._M_value = (_ComplexT_conflict)(incx >> 0x1f & (1 - n) * incx);
    pfVar4 = (float *)((long)&cy[incy >> 0x1f & (1 - n) * incy]._M_value + 4);
    pcVar3 = cx + cVar1._M_value;
    do {
      fVar6 = (float)pcVar3->_M_value;
      fVar5 = (float)(pcVar3->_M_value >> 0x20);
      if ((NAN(pfVar4[-1] * fVar6 - fVar5 * *pfVar4)) && (NAN(pfVar4[-1] * fVar5 + fVar6 * *pfVar4))
         ) {
        cVar1._M_value = __mulsc3(fVar6);
      }
      pfVar4 = pfVar4 + (long)incy * 2;
      pcVar3 = pcVar3 + incx;
      n = n + -1;
    } while (n != 0);
  }
  return (complex<float>)cVar1._M_value;
}

Assistant:

complex <float> cdotu ( int n, complex <float> cx[], int incx,
  complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CDOTU forms the unconjugated dot product of two vectors.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <float> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <float> CDOTU, the unconjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <float> value;

  value = complex <float> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + cx[i] * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + cx[ix] * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}